

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_fixed_suite::fixed_ctor_const_array(void)

{
  undefined8 local_30;
  undefined4 local_24;
  
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x30e,"void api_fixed_suite::fixed_ctor_const_array()",true);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x30f,"void api_fixed_suite::fixed_ctor_const_array()",true);
  local_30 = 0;
  local_24 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x310,"void api_fixed_suite::fixed_ctor_const_array()",&local_30,&local_24);
  local_30 = 4;
  local_24 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x311,"void api_fixed_suite::fixed_ctor_const_array()",&local_30,&local_24);
  return;
}

Assistant:

void fixed_ctor_const_array()
{
    int array[4] = {};
    circular_view<const int, 4> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
}